

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void vfmaddsub231ps_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  long lVar4;
  
  if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    UVar1 = (pMyDisasm->Reserved_).EVEX.state;
    if (UVar1 == '\x01') {
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
    }
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      if ((pMyDisasm->Reserved_).REX.W_ == '\0') {
        if (UVar1 == '\x01') goto LAB_00134fc4;
LAB_00134fd9:
        uVar3 = 0x73703133326275;
      }
      else {
        if (UVar1 == '\x01') {
LAB_00134fc4:
          if ((pMyDisasm->Reserved_).EVEX.W == '\0') goto LAB_00134fd9;
        }
        uVar3 = 0x64703133326275;
      }
      *(undefined8 *)((pMyDisasm->Instruction).Mnemonic + 7) = uVar3;
      (pMyDisasm->Instruction).Mnemonic[0] = 'v';
      (pMyDisasm->Instruction).Mnemonic[1] = 'f';
      (pMyDisasm->Instruction).Mnemonic[2] = 'm';
      (pMyDisasm->Instruction).Mnemonic[3] = 'a';
      (pMyDisasm->Instruction).Mnemonic[4] = 'd';
      (pMyDisasm->Instruction).Mnemonic[5] = 'd';
      (pMyDisasm->Instruction).Mnemonic[6] = 's';
      (pMyDisasm->Instruction).Mnemonic[7] = 'u';
      ArgsVEX(pMyDisasm);
      uVar2 = 3;
      lVar4 = 0x1c8;
      goto LAB_00135007;
    }
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  uVar2 = 0xffffffff;
  lVar4 = 0x924;
LAB_00135007:
  *(undefined4 *)(pMyDisasm->CompleteInstr + lVar4 + -0x14) = uVar2;
  return;
}

Assistant:

void __bea_callspec__ vfmaddsub231ps_(PDISASM pMyDisasm)
{
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
       if (GV.VEX.state == InUsePrefix) {
         if (
            ((GV.REX.W_ == 0x0) && (GV.EVEX.state != InUsePrefix)) ||
            ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))) {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vfmaddsub231ps");
           #endif
         } else {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vfmaddsub231pd");
           #endif

         }
         ArgsVEX(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;
       } else {
         failDecode(pMyDisasm);
       }
   }
   else {
       failDecode(pMyDisasm);
   }
}